

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  bool bVar1;
  Value *in_RSI;
  long in_RDI;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string *psVar2;
  string local_80 [20];
  CommentPlacement in_stack_ffffffffffffff94;
  Value *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [32];
  Value *local_10;
  
  local_10 = in_RSI;
  bVar1 = Value::hasComment(in_RSI,commentAfterOnSameLine);
  if (bVar1) {
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),local_30);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
  }
  bVar1 = Value::hasComment(local_10,commentAfter);
  if (bVar1) {
    this_00 = (string *)(in_RDI + 0x20);
    std::__cxx11::string::operator+=(this_00,"\n");
    psVar2 = local_80;
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    std::__cxx11::string::operator+=(this_00,psVar2);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),"\n");
  }
  return;
}

Assistant:

void StyledWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    document_ += " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    document_ += "\n";
    document_ += root.getComment(commentAfter);
    document_ += "\n";
  }
}